

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O1

size_t gguf_get_meta_size(gguf_context *ctx)

{
  pointer pcVar1;
  pointer pcVar2;
  vector<signed_char,_std::allocator<signed_char>_> buf;
  vector<signed_char,_std::allocator<signed_char>_> local_28;
  
  local_28.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  gguf_write_to_buf(ctx,&local_28,true);
  pcVar2 = local_28.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pcVar1 = local_28.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_28.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return (long)pcVar2 - (long)pcVar1;
}

Assistant:

size_t gguf_get_meta_size(const struct gguf_context * ctx) {
    // only return size
    std::vector<int8_t> buf;
    gguf_write_to_buf(ctx, buf, /*only_meta =*/ true);
    return buf.size();
}